

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
::clear(raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
        *this)

{
  slot_type *psVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  if (this->size_ != 0) {
    if (this->capacity_ < 0x80) {
      if (this->capacity_ != 0) {
        sVar3 = this->capacity_;
        if (sVar3 != 0) {
          lVar4 = 0;
          sVar2 = 0;
          do {
            if (-1 < this->ctrl_[sVar2]) {
              psVar1 = this->slots_;
              cs_impl::any::recycle((any *)((long)psVar1 + lVar4 + 8));
              cs_impl::any::recycle((any *)((long)psVar1 + lVar4));
            }
            sVar2 = sVar2 + 1;
            sVar3 = this->capacity_;
            lVar4 = lVar4 + 0x10;
          } while (sVar2 != sVar3);
        }
        this->size_ = 0;
        memset(this->ctrl_,0x80,sVar3 + 0x10);
        this->ctrl_[sVar3] = -1;
        reset_growth_left(this,this->capacity_);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x5a2,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs_impl::any>>>::clear() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs_impl::any>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const
			{
				return !size();
			}